

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_2,_0>::~BeagleCPUImpl(BeagleCPUImpl<double,_2,_0> *this)

{
  threadData *ptVar1;
  shared_future<void> *psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int i_5;
  long lVar4;
  long lVar5;
  uint i;
  ulong uVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  unique_lock<std::mutex> l;
  
  (this->super_BeagleImpl)._vptr_BeagleImpl = (_func_int **)&PTR__BeagleCPUImpl_001566f0;
  for (uVar6 = 0; uVar6 < (uint)this->kEigenDecompCount; uVar6 = uVar6 + 1) {
    free(this->gCategoryWeights[uVar6]);
    free(this->gStateFrequencies[uVar6]);
  }
  for (uVar6 = 0; uVar6 < (uint)this->kMatrixCount; uVar6 = uVar6 + 1) {
    free(this->gTransitionMatrices[uVar6]);
  }
  free(this->gTransitionMatrices);
  for (uVar6 = 0; uVar6 < *(uint *)&(this->super_BeagleImpl).field_0xc; uVar6 = uVar6 + 1) {
    free(this->gPartials[uVar6]);
    free(this->gTipStates[uVar6]);
  }
  free(this->gPartials);
  free(this->gTipStates);
  if ((this->kFlags & 0x80) == 0) {
    for (uVar6 = 0; uVar6 < (uint)this->kScaleBufferCount; uVar6 = uVar6 + 1) {
      free(this->gScaleBuffers[uVar6]);
    }
  }
  else {
    for (uVar6 = 0; uVar6 < (uint)this->kScaleBufferCount; uVar6 = uVar6 + 1) {
      free(this->gAutoScaleBuffers[uVar6]);
    }
    free(this->gAutoScaleBuffers);
    free(this->gActiveScalingFactors);
    free(*this->gScaleBuffers);
  }
  free(this->gScaleBuffers);
  free(this->gCategoryRates);
  free(this->gPatternWeights);
  if (this->kPartitionsInitialised == true) {
    free(this->gPatternPartitions);
    free(this->gPatternPartitionsStartPatterns);
    if (this->kPatternsReordered == true) {
      free(this->gPatternsNewOrder);
    }
  }
  free(this->integrationTmp);
  free(this->firstDerivTmp);
  free(this->secondDerivTmp);
  free(this->grandDenominatorDerivTmp);
  free(this->grandNumeratorDerivTmp);
  free(this->crossProductNumeratorTmp);
  free(this->outLogLikelihoodsTmp);
  free(this->outFirstDerivativesTmp);
  free(this->outSecondDerivativesTmp);
  free(this->ones);
  free(this->zeros);
  if (this->gEigenDecomposition != (EigenDecomposition<double,_2> *)0x0) {
    (*this->gEigenDecomposition->_vptr_EigenDecomposition[1])();
  }
  if (this->kThreadingEnabled == true) {
    lVar4 = 0x58;
    for (lVar5 = 0; uVar6 = (ulong)this->kNumThreads, lVar5 < (long)uVar6; lVar5 = lVar5 + 1) {
      ptVar1 = this->gThreads;
      std::unique_lock<std::mutex>::unique_lock
                (&l,(mutex_type *)
                    ((long)&(ptVar1->jobs).c.
                            super__Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_node + lVar4));
      (&ptVar1->cv)[lVar4] = (condition_variable)0x1;
      std::condition_variable::notify_one();
      std::unique_lock<std::mutex>::~unique_lock(&l);
      lVar4 = lVar4 + 0xb8;
    }
    for (lVar4 = 0; ptVar1 = this->gThreads, lVar4 < (int)uVar6; lVar4 = lVar4 + 1) {
      std::thread::join();
      uVar6 = (ulong)(uint)this->kNumThreads;
    }
    if (ptVar1 != (threadData *)0x0) {
      if (*(long *)&ptVar1[-1].stop != 0) {
        lVar4 = *(long *)&ptVar1[-1].stop * 0xb8;
        do {
          threadData::~threadData((threadData *)((long)&ptVar1[-1].t._M_id._M_thread + lVar4));
          lVar4 = lVar4 + -0xb8;
        } while (lVar4 != 0);
      }
      operator_delete__(&ptVar1[-1].stop);
    }
    psVar2 = this->gFutures;
    if (psVar2 != (shared_future<void> *)0x0) {
      p_Var3 = psVar2[-1].super___basic_future<void>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      p_Var7 = &psVar2[-1].super___basic_future<void>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        lVar4 = (long)p_Var3 << 4;
        do {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&p_Var7->_M_pi + lVar4));
          lVar4 = lVar4 + -0x10;
        } while (lVar4 != 0);
      }
      operator_delete__(p_Var7);
    }
    for (lVar4 = 0; lVar4 < this->kNumThreads; lVar4 = lVar4 + 1) {
      free(this->gThreadOperations[lVar4]);
    }
    free(this->gThreadOperations);
    free(this->gThreadOpCounts);
  }
  if (this->kAutoPartitioningEnabled == true) {
    free(this->gAutoPartitionOperations);
    if (this->kAutoRootPartitioningEnabled == true) {
      free(this->gAutoPartitionIndices);
      free(this->gAutoPartitionOutSumLogLikelihoods);
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
BeagleCPUImpl<BEAGLE_CPU_GENERIC>::~BeagleCPUImpl() {
    // free all that stuff...
    // If you delete partials, make sure not to delete the last element
    // which is TEMP_SCRATCH_PARTIAL twice.

    for(unsigned int i=0; i<kEigenDecompCount; i++) {
        if (gCategoryWeights[i] != NULL)
            free(gCategoryWeights[i]);
        if (gStateFrequencies[i] != NULL)
            free(gStateFrequencies[i]);
    }

    for(unsigned int i=0; i<kMatrixCount; i++) {
        if (gTransitionMatrices[i] != NULL)
            free(gTransitionMatrices[i]);
    }
    free(gTransitionMatrices);

    for(unsigned int i=0; i<kBufferCount; i++) {
        if (gPartials[i] != NULL)
            free(gPartials[i]);
        if (gTipStates[i] != NULL)
            free(gTipStates[i]);
    }
    free(gPartials);
    free(gTipStates);

    if (kFlags & BEAGLE_FLAG_SCALING_AUTO) {
        for(unsigned int i=0; i<kScaleBufferCount; i++) {
            if (gAutoScaleBuffers[i] != NULL)
                free(gAutoScaleBuffers[i]);
        }
        if (gAutoScaleBuffers)
            free(gAutoScaleBuffers);
        free(gActiveScalingFactors);
        if (gScaleBuffers[0] != NULL)
            free(gScaleBuffers[0]);
    } else {
        for(unsigned int i=0; i<kScaleBufferCount; i++) {
            if (gScaleBuffers[i] != NULL)
                free(gScaleBuffers[i]);
        }
    }

    if (gScaleBuffers)
        free(gScaleBuffers);

    free(gCategoryRates);
    free(gPatternWeights);

    if (kPartitionsInitialised) {
        free(gPatternPartitions);
        free(gPatternPartitionsStartPatterns);
        if (kPatternsReordered) {
            free(gPatternsNewOrder);
        }
    }

    free(integrationTmp);
    free(firstDerivTmp);
    free(secondDerivTmp);

//    free(cLikelihoodTmp);
    free(grandDenominatorDerivTmp);
//    free(grandNumeratorUpperBoundDerivTmp);
//    free(grandNumeratorLowerBoundDerivTmp);
    free(grandNumeratorDerivTmp);

    if (crossProductNumeratorTmp != nullptr) {
        free(crossProductNumeratorTmp);
    }

    free(outLogLikelihoodsTmp);
    free(outFirstDerivativesTmp);
    free(outSecondDerivativesTmp);

    free(ones);
    free(zeros);

    delete gEigenDecomposition;

    if (kThreadingEnabled) {
        // Send stop signal to all threads and join them...
        for (int i = 0; i < kNumThreads; i++) {
            threadData* td = &gThreads[i];
            std::unique_lock<std::mutex> l(td->m);
            td->stop = true;
            td->cv.notify_one();
        }

        // Join all the threads
        for (int i = 0; i < kNumThreads; i++) {
            threadData* td = &gThreads[i];
            td->t.join();
        }

        delete[] gThreads;
        delete[] gFutures;

        for (int i=0; i<kNumThreads; i++) {
            free(gThreadOperations[i]);
        }
        free(gThreadOperations);
        free(gThreadOpCounts);
    }

    if (kAutoPartitioningEnabled) {
        free(gAutoPartitionOperations);
        if (kAutoRootPartitioningEnabled) {
            free(gAutoPartitionIndices);
            free(gAutoPartitionOutSumLogLikelihoods);
        }
    }
}